

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_on_begin_effect(parser *p)

{
  long *plVar1;
  void *pvVar2;
  long *local_28;
  effect *effect;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  plVar1 = (long *)parser_priv(p);
  if (plVar1 != (long *)0x0) {
    if (*plVar1 == 0) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      pvVar2 = mem_zalloc(0x38);
      plVar1[1] = (long)pvVar2;
      if (*(long *)(*plVar1 + 0x48) == 0) {
        *(long *)(*plVar1 + 0x48) = plVar1[1];
      }
      else {
        for (local_28 = *(long **)(*plVar1 + 0x48); *local_28 != 0; local_28 = (long *)*local_28) {
        }
        *local_28 = plVar1[1];
      }
      p_local._4_4_ = grab_effect_data(p,(effect *)plVar1[1]);
    }
    return p_local._4_4_;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x1b1,"enum parser_error parse_player_timed_on_begin_effect(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_on_begin_effect(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	struct effect *effect;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Go to the next vacant effect and set it to the new one. */
	ps->e = mem_zalloc(sizeof(*effect));
	if (ps->t->on_begin_effect) {
		effect = ps->t->on_begin_effect;
		while (effect->next) effect = effect->next;
		effect->next = ps->e;
	} else {
		ps->t->on_begin_effect = ps->e;
	}
	/* Fill in the details. */
	return grab_effect_data(p, ps->e);
}